

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,MethodDeclaration *ptr)

{
  Type *second;
  Method_args *second_00;
  Body *second_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_21;
  
  std::operator+(&local_48,"method decl: ",ptr->name);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  second = ptr->type;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"type",&local_21);
  arrow(this,ptr,second,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->type->super_Base)._vptr_Base)(ptr->type,this);
  second_00 = ptr->args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"args",&local_21);
  arrow(this,ptr,second_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->args->super_Base)._vptr_Base)(ptr->args,this);
  second_01 = ptr->body;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"body",&local_21);
  arrow(this,ptr,second_01,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->body->super_Base)._vptr_Base)(ptr->body,this);
  return;
}

Assistant:

void gv_visitor::visit(MethodDeclaration* ptr) {
    box(ptr, "method decl: " + *ptr->name);
    arrow(ptr, ptr->type, "type");
    ptr->type->accept(this);
    arrow(ptr, ptr->args, "args");
    ptr->args->accept(this);
    arrow(ptr, ptr->body, "body");
    ptr->body->accept(this);
    //name
}